

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data;
  FILE *whereto;
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  uint uVar4;
  long seconds;
  int iVar5;
  long lVar6;
  timediff_t tVar7;
  long lVar8;
  curl_off_t cVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  curltime cVar18;
  curltime older;
  curltime newer;
  curltime newer_00;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  if (((data->progress).flags & 0x10) == 0) {
    if ((data->set).fxferinfo != (curl_xferinfo_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar5 = (*(data->set).fxferinfo)
                        ((data->set).progress_client,(data->progress).size_dl,
                         (data->progress).downloaded,(data->progress).size_ul,
                         (data->progress).uploaded);
LAB_004b2ddf:
      Curl_set_in_callback(data,false);
      if (iVar5 == 0) {
        return 0;
      }
      Curl_failf(data,"Callback aborted");
      return iVar5;
    }
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar5 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).size_dl,
                         (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                         (double)(data->progress).uploaded);
      goto LAB_004b2ddf;
    }
  }
  lVar14 = (data->progress).downloaded;
  lVar11 = (data->progress).uploaded;
  cVar18 = Curl_now();
  lVar6 = cVar18.tv_sec;
  uVar2 = (data->progress).start.tv_sec;
  uVar3 = (data->progress).start.tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  older._12_4_ = 0;
  auVar1 = cVar18._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  tVar7 = Curl_timediff_us(newer,older);
  seconds = tVar7 / 1000000;
  lVar10 = 999999;
  if (lVar14 < 0x20c49ba5e353f7) {
    lVar10 = 999;
  }
  (data->progress).timespent = tVar7;
  lVar16 = seconds;
  if (lVar14 < 0x20c49ba5e353f7) {
    lVar16 = tVar7 / 1000;
  }
  lVar17 = 999999;
  lVar8 = lVar14 * 1000;
  if (0x20c49ba5e353f6 < lVar14) {
    lVar8 = lVar14;
  }
  if (tVar7 <= lVar10) {
    lVar16 = 1;
  }
  lVar14 = seconds;
  if (lVar11 < 0x20c49ba5e353f7) {
    lVar17 = 999;
    lVar11 = lVar11 * 1000;
    lVar14 = tVar7 / 1000;
  }
  (data->progress).dlspeed = lVar8 / lVar16;
  if (tVar7 <= lVar17) {
    lVar14 = 1;
  }
  (data->progress).ulspeed = lVar11 / lVar14;
  if ((data->progress).lastshow == lVar6) {
    return 0;
  }
  iVar5 = (data->progress).speeder_c;
  iVar13 = iVar5 % 6;
  uVar15 = (data->progress).flags;
  (data->progress).lastshow = lVar6;
  (data->progress).speeder[iVar13] = (data->progress).uploaded + (data->progress).downloaded;
  (data->progress).speeder_time[iVar13].tv_sec = lVar6;
  (data->progress).speeder_time[iVar13].tv_usec = cVar18.tv_usec;
  (data->progress).speeder_c = iVar5 + 1U;
  if (iVar5 == 0) {
    cVar9 = lVar11 / lVar14 + lVar8 / lVar16;
  }
  else {
    uVar4 = 0;
    if (4 < iVar5) {
      uVar4 = (iVar5 + 1U) % 6;
    }
    cVar18.tv_usec =
         *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + (ulong)(uVar4 << 4));
    cVar18.tv_sec =
         *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + (ulong)(uVar4 << 4));
    cVar18._12_4_ = 0;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = auVar1._0_8_;
    newer_00.tv_usec = auVar1._8_4_;
    tVar7 = Curl_timediff(newer_00,cVar18);
    lVar11 = tVar7 + (ulong)(tVar7 == 0);
    lVar14 = (data->progress).speeder[iVar13] - (data->progress).speeder[uVar4];
    if (lVar14 < 0x418938) {
      cVar9 = (lVar14 * 1000) / lVar11;
    }
    else {
      cVar9 = (curl_off_t)((double)lVar14 / ((double)lVar11 / 1000.0));
    }
  }
  (data->progress).current_speed = cVar9;
  if ((uVar15 & 0x10) != 0) {
    return 0;
  }
  uVar15 = (data->progress).flags;
  if (-1 < (char)uVar15) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar15 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar15;
  }
  if (((uVar15 & 0x20) == 0) || (lVar14 = (data->progress).ulspeed, lVar14 < 1)) {
    local_a8 = 0;
    lVar14 = 0;
  }
  else {
    uVar12 = (data->progress).size_ul;
    lVar14 = (long)uVar12 / lVar14;
    if ((long)uVar12 < 0x2711) {
      if ((long)uVar12 < 1) {
        local_a8 = 0;
        goto LAB_004b3100;
      }
      cVar9 = (data->progress).uploaded * 100;
    }
    else {
      cVar9 = (data->progress).uploaded;
      uVar12 = uVar12 / 100;
    }
    local_a8 = cVar9 / (long)uVar12;
  }
LAB_004b3100:
  if (((uVar15 & 0x40) == 0) || (lVar11 = (data->progress).dlspeed, lVar11 < 1)) {
    local_a0 = 0;
    lVar11 = 0;
  }
  else {
    uVar12 = (data->progress).size_dl;
    lVar11 = (long)uVar12 / lVar11;
    if ((long)uVar12 < 0x2711) {
      if ((long)uVar12 < 1) {
        local_a0 = 0;
        goto LAB_004b317d;
      }
      cVar9 = (data->progress).downloaded * 100;
    }
    else {
      cVar9 = (data->progress).downloaded;
      uVar12 = uVar12 / 100;
    }
    local_a0 = cVar9 / (long)uVar12;
  }
LAB_004b317d:
  if (lVar11 < lVar14) {
    lVar11 = lVar14;
  }
  cVar9 = 0;
  if (0 < lVar11) {
    cVar9 = lVar11 - seconds;
  }
  time2str(time_left,cVar9);
  time2str(time_total,lVar11);
  time2str(local_96,seconds);
  uVar15 = (data->progress).flags;
  uVar12 = (&(data->progress).size_dl)[(ulong)((uVar15 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar15 & 0x20) == 0) * 2];
  lVar14 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar12 < 0x2711) {
    if ((long)uVar12 < 1) {
      lVar14 = 0;
    }
    else {
      lVar14 = (lVar14 * 100) / (long)uVar12;
    }
  }
  else {
    lVar14 = lVar14 / (long)(uVar12 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar12,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar14,max5 + 2,local_a0,
                max5,local_a8,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
  }
  progress_meter(conn);

  return 0;
}